

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_filter.hpp
# Opt level: O2

string * __thiscall Filter::VSParams_abi_cxx11_(string *__return_storage_ptr__,Filter *this)

{
  ostream *poVar1;
  pointer pPVar2;
  vector<Param,_std::allocator<Param>_> params;
  string type_name;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  (*this->_vptr_Filter[4])(&params,this);
  for (pPVar2 = params.super__Vector_base<Param,_std::allocator<Param>_>._M_impl.
                super__Vector_impl_data._M_start;
      pPVar2 != params.super__Vector_base<Param,_std::allocator<Param>_>._M_impl.
                super__Vector_impl_data._M_finish; pPVar2 = pPVar2 + 1) {
    if (pPVar2->VSEnabled == true) {
      type_name._M_dataplus._M_p = (pointer)&type_name.field_2;
      type_name._M_string_length = 0;
      type_name.field_2._M_local_buf[0] = '\0';
      if (pPVar2->Type < (String|Integer)) {
        std::__cxx11::string::assign((char *)&type_name);
      }
      poVar1 = std::operator<<(local_1a8,pPVar2->Name);
      poVar1 = std::operator<<(poVar1,':');
      std::operator<<(poVar1,(string *)&type_name);
      if (pPVar2->IsArray == true) {
        std::operator<<(local_1a8,"[]");
      }
      if (pPVar2->IsOptional == true) {
        std::operator<<(local_1a8,":opt");
      }
      std::operator<<(local_1a8,';');
      std::__cxx11::string::~string((string *)&type_name);
    }
  }
  std::__cxx11::stringbuf::str();
  std::_Vector_base<Param,_std::allocator<Param>_>::~_Vector_base
            (&params.super__Vector_base<Param,_std::allocator<Param>_>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

virtual const std::string VSParams() const
  {
    std::stringstream ss;
    auto params = this->Params();
    for (auto &&p : params)
    {
      if (!p.VSEnabled) continue;
      std::string type_name;
      switch(p.Type) {
        case Clip: type_name = "clip"; break;
        case Integer: type_name = "int"; break;
        case Float: type_name = "float"; break;
        case Boolean: type_name = "int"; break;
        case String: type_name = "data"; break;
      }
      ss << p.Name << ':' << type_name;
      if (p.IsArray)
        ss << "[]";
      if (p.IsOptional)
        ss << ":opt";
      ss << ';';
    }
    return ss.str();
  }